

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vec4f * __thiscall
DepthShader::vertex(vec4f *__return_storage_ptr__,DepthShader *this,Model *model,int iface,
                   int nthvert)

{
  size_t idx;
  double *rhs;
  vec4f *gl_Vertex;
  vec<4UL,_double> local_190;
  vec<3UL,_double> local_170;
  mat<4UL,_4UL> local_158;
  mat<4UL,_4UL> local_d8;
  vec<4UL,_double> local_58;
  vec3f local_38;
  int local_20;
  int local_1c;
  int nthvert_local;
  int iface_local;
  Model *model_local;
  DepthShader *this_local;
  
  local_20 = nthvert;
  local_1c = iface;
  _nthvert_local = model;
  model_local = (Model *)this;
  Model::vert(&local_38,model,(long)iface,(long)nthvert);
  embed<4ul,3ul,double>(__return_storage_ptr__,&local_38,1.0);
  operator*(&local_158,&(this->super_IShader).uniform_Viewport,
            &(this->super_IShader).uniform_Projection);
  operator*(&local_d8,&local_158,&(this->super_IShader).uniform_ModelView);
  operator*(&local_58,&local_d8,__return_storage_ptr__);
  __return_storage_ptr__->data[0] = local_58.data[0];
  __return_storage_ptr__->data[1] = local_58.data[1];
  __return_storage_ptr__->data[2] = local_58.data[2];
  __return_storage_ptr__->data[3] = local_58.data[3];
  idx = (size_t)local_20;
  rhs = vec<4UL,_double>::operator[](__return_storage_ptr__,3);
  operator/(&local_190,__return_storage_ptr__,rhs);
  proj<3ul,4ul,double>(&local_170,&local_190);
  mat<3UL,_3UL>::set_col(&this->varying_tri,idx,&local_170);
  return __return_storage_ptr__;
}

Assistant:

virtual vec4f vertex(Model& model, int iface, int nthvert)
    {
        vec4f gl_Vertex = embed<4>(model.vert(iface, nthvert));  // read the vertex from .obj file
        gl_Vertex = uniform_Viewport * uniform_Projection * uniform_ModelView *
                    gl_Vertex;  // transform it to screen coordinates
        varying_tri.set_col(nthvert, proj<3>(gl_Vertex / gl_Vertex[3]));
        return gl_Vertex;
    }